

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O3

void helicsEndpointSendString(HelicsEndpoint endpoint,char *message,HelicsError *err)

{
  Endpoint *this;
  void *__buf;
  size_t in_RCX;
  int in_R8D;
  
  if (err == (HelicsError *)0x0) {
    if (endpoint == (HelicsEndpoint)0x0) {
      return;
    }
    if (*(int *)((long)endpoint + 0x20) != -0x4bac6b3e) {
      return;
    }
  }
  else {
    if (err->error_code != 0) {
      return;
    }
    if ((endpoint == (HelicsEndpoint)0x0) || (*(int *)((long)endpoint + 0x20) != -0x4bac6b3e)) {
      err->error_code = -3;
      err->message = "The given endpoint does not point to a valid object";
      return;
    }
  }
  this = *endpoint;
  if (message == (char *)0x0) {
    helics::Endpoint::send
              (this,(int)gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p,
               (void *)gHelicsEmptyStr_abi_cxx11_._M_string_length,in_RCX,in_R8D);
  }
  else {
    __buf = (void *)strlen(message);
    helics::Endpoint::send(this,(int)message,__buf,in_RCX,in_R8D);
  }
  return;
}

Assistant:

void helicsEndpointSendString(HelicsEndpoint endpoint, const char* message, HelicsError* err)
{
    auto* endObj = verifyEndpoint(endpoint, err);
    if (endObj == nullptr) {
        return;
    }
    try {
        if (message == nullptr) {
            endObj->endPtr->send(gHelicsEmptyStr);
        } else {
            endObj->endPtr->send(message);
        }
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}